

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O1

void TPZShapeHCurlNoGrads<pzshape::TPZShapeTetra>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *curlphi)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int x;
  long lVar6;
  long lVar7;
  int i;
  long lVar8;
  TPZVec<int> filtVecShape;
  TPZFMatrix<double> phi_unfilt;
  TPZFMatrix<double> curlphi_unfilt;
  TPZVec<int> local_1c0;
  int aiStack_1a0 [12];
  TPZVec<int> local_170;
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> local_c0;
  
  uVar1 = pztopology::TPZTetrahedron::NumSides(1);
  TPZVec<int>::TPZVec(&local_1c0,0);
  local_1c0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e5470;
  local_1c0.fStore = aiStack_1a0;
  local_1c0.fNElements = 0xb;
  local_1c0.fNAlloc = 0;
  aiStack_1a0[0] = 0;
  aiStack_1a0[1] = 0;
  aiStack_1a0[2] = 0;
  aiStack_1a0[3] = 0;
  aiStack_1a0[4] = 0;
  aiStack_1a0[5] = 0;
  aiStack_1a0[6] = 0;
  aiStack_1a0[7] = 0;
  aiStack_1a0[8] = 0;
  aiStack_1a0[9] = 0;
  aiStack_1a0[10] = 0;
  iVar2 = TPZShapeHCurl<pzshape::TPZShapeTetra>::ComputeNConnectShapeF
                    (0,*(data->fHDivConnectOrders).super_TPZVec<int>.fStore);
  lVar8 = 1;
  do {
    local_1c0.fStore[lVar8] = iVar2;
    iVar3 = TPZShapeHCurl<pzshape::TPZShapeTetra>::ComputeNConnectShapeF
                      ((int)lVar8,(data->fHDivConnectOrders).super_TPZVec<int>.fStore[lVar8]);
    iVar2 = iVar2 + iVar3;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0xb);
  lVar8 = (long)iVar2;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_150.fElem = (double *)0x0;
  local_150.fGiven = (double *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar8;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_150.fWork.fStore = (double *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  if (iVar2 != 0) {
    uVar4 = 0xffffffffffffffff;
    if ((ulong)(lVar8 * 3) < 0x2000000000000000) {
      uVar4 = lVar8 * 0x18;
    }
    local_150.fElem = (double *)operator_new__(uVar4);
  }
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_c0.fElem = (double *)0x0;
  local_c0.fGiven = (double *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar8;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_c0.fWork.fStore = (double *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  if (iVar2 != 0) {
    uVar4 = 0xffffffffffffffff;
    if ((ulong)(lVar8 * 3) < 0x2000000000000000) {
      uVar4 = lVar8 * 0x18;
    }
    local_c0.fElem = (double *)operator_new__(uVar4);
  }
  TPZShapeHCurl<pzshape::TPZShapeTetra>::Shape(pt,data,&local_150,&local_c0);
  if ((int)uVar1 < 1) {
    uVar4 = 0;
  }
  else {
    lVar8 = 0;
    uVar4 = 0;
    do {
      iVar2 = local_1c0.fStore[uVar4];
      lVar7 = (long)iVar2;
      lVar5 = lVar7 + 1;
      lVar6 = 0;
      do {
        if (((local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) || (iVar2 < 0))
           || (local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar7)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) || (iVar2 < -1))
           || (local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar4)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(double *)
         ((long)phi->fElem +
         lVar6 * 8 + (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar8) =
             local_150.fElem
             [local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7 + lVar6] +
             local_150.fElem
             [local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar5 + lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      lVar6 = 0;
      do {
        if (((local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) || (iVar2 < 0)) ||
           (local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar7)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) || (iVar2 < -1))
           || (local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6) ||
           ((curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar4)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(double *)
         ((long)curlphi->fElem +
         lVar6 * 8 + (curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar8) =
             local_c0.fElem
             [local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7 + lVar6] +
             local_c0.fElem
             [local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar5 + lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      uVar4 = uVar4 + 1;
      lVar8 = lVar8 + 8;
    } while (uVar4 != uVar1);
    uVar4 = uVar4 & 0xffffffff;
  }
  local_170._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  local_170.fStore = (int *)0x0;
  local_170.fNElements = 0;
  local_170.fNAlloc = 0;
  HighOrderFunctionsFilter(&local_1c0,&(data->fHDivConnectOrders).super_TPZVec<int>,&local_170);
  if (0 < local_170.fNElements) {
    lVar8 = uVar4 * 8;
    lVar5 = 0;
    do {
      iVar2 = local_170.fStore[lVar5];
      lVar6 = (long)iVar2;
      lVar7 = 0;
      do {
        if (((local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) || (iVar2 < 0)) ||
           (local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar6)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7) ||
           ((curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar4)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(double *)
         ((long)curlphi->fElem +
         lVar7 * 8 + (curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar8) =
             local_c0.fElem
             [local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar6 + lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      lVar7 = 0;
      do {
        if (((local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) || (iVar2 < 0))
           || (local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar6)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar4)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(double *)
         ((long)phi->fElem +
         lVar7 * 8 + (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar8) =
             local_150.fElem
             [local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar6 + lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 1;
      lVar8 = lVar8 + 8;
    } while (lVar5 != local_170.fNElements);
  }
  local_170._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_170.fStore != (int *)0x0) {
    operator_delete__(local_170.fStore);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  TPZFMatrix<double>::~TPZFMatrix(&local_150);
  if (local_1c0.fStore == aiStack_1a0) {
    local_1c0.fStore = (int *)0x0;
  }
  local_1c0.fNAlloc = 0;
  local_1c0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_1c0.fStore != (int *)0x0) {
    operator_delete__(local_1c0.fStore);
  }
  return;
}

Assistant:

void TPZShapeHCurlNoGrads<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &curlphi)
{

    constexpr int ncorner = TSHAPE::NCornerNodes;
    constexpr int nsides = TSHAPE::NSides;
    constexpr int ncon = nsides - ncorner;
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nedges = TSHAPE::NumSides(1);
    
    //calculates # of unfiltered hcurl functions
    const auto &connectorders = data.fHDivConnectOrders;
    //first_hcurl_side[i] is the index of the first shape function associated with side i
    TPZManVector<int,ncon> first_hcurl_side(ncon,0);
    //total number of unfiltered funcs
    int n_unfilt = 0;

    {
      n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(0,connectorders[0]);
      for (int i = 1; i < ncon; i++){
        first_hcurl_side[i] = n_unfilt;
        n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(i,connectorders[i]);
      }
    }
    
    //computes  unfiltered hcurl funcs
    TPZFMatrix<REAL> phi_unfilt(dim,n_unfilt), curlphi_unfilt(curldim,n_unfilt);
    TPZShapeHCurl<TSHAPE>::Shape(pt, data, phi_unfilt, curlphi_unfilt);

    //now we filter the functions
    int fcount = 0;
    //edges: we sum the lowest order functions on the edge
    for(auto ie = 0; ie < nedges; ie++){
      //fss = first side shape
      const auto fss = first_hcurl_side[ie];
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fss) + phi_unfilt(x,fss+1);
      }
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fss) + curlphi_unfilt(x,fss+1);
      }
      fcount++;
    }
    if constexpr (dim < 2) return;

    TPZVec<int> filtVecShape;
    HighOrderFunctionsFilter(first_hcurl_side, connectorders,filtVecShape);

    const auto newfuncs = filtVecShape.size();
    
    for(int ifunc = 0; ifunc < newfuncs; ifunc++){
      const auto fi = filtVecShape[ifunc];
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fi);
      }
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fi);
      }
      fcount++;
    } 
    
    
}